

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O2

uint64_t __thiscall leveldb::Table::ApproximateOffsetOf(Table *this,Slice *key)

{
  int iVar1;
  Iterator *pIVar2;
  undefined4 extraout_var;
  Slice *pSVar3;
  char *pcVar4;
  Status s;
  BlockHandle handle;
  Slice input;
  undefined1 local_50 [12];
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_30;
  
  pIVar2 = Block::NewIterator(this->rep_->index_block,(this->rep_->options).comparator);
  (*pIVar2->_vptr_Iterator[5])(pIVar2,key);
  iVar1 = (*pIVar2->_vptr_Iterator[2])(pIVar2);
  if ((char)iVar1 == '\0') {
    pcVar4 = (char *)(this->rep_->metaindex_handle).offset_;
  }
  else {
    local_50._8_4_ = 0xffffffff;
    uStack_44 = 0xffffffff;
    uStack_40 = 0xffffffff;
    uStack_3c = 0xffffffff;
    iVar1 = (*pIVar2->_vptr_Iterator[9])(pIVar2);
    local_30 = CONCAT44(extraout_var,iVar1);
    BlockHandle::DecodeFrom((BlockHandle *)local_50,(Slice *)(local_50 + 8));
    pSVar3 = (Slice *)&this->rep_->metaindex_handle;
    if (local_50._0_8_ == 0) {
      pSVar3 = (Slice *)(local_50 + 8);
    }
    pcVar4 = pSVar3->data_;
    Status::~Status((Status *)local_50);
  }
  (*pIVar2->_vptr_Iterator[1])(pIVar2);
  return (uint64_t)pcVar4;
}

Assistant:

uint64_t Table::ApproximateOffsetOf(const Slice& key) const {
  Iterator* index_iter =
      rep_->index_block->NewIterator(rep_->options.comparator);
  index_iter->Seek(key);
  uint64_t result;
  if (index_iter->Valid()) {
    BlockHandle handle;
    Slice input = index_iter->value();
    Status s = handle.DecodeFrom(&input);
    if (s.ok()) {
      result = handle.offset();
    } else {
      // Strange: we can't decode the block handle in the index block.
      // We'll just return the offset of the metaindex block, which is
      // close to the whole file size for this case.
      result = rep_->metaindex_handle.offset();
    }
  } else {
    // key is past the last key in the file.  Approximate the offset
    // by returning the offset of the metaindex block (which is
    // right near the end of the file).
    result = rep_->metaindex_handle.offset();
  }
  delete index_iter;
  return result;
}